

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCast>>
               (interval_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  Vector *result;
  ulong uVar9;
  bool bVar10;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  string_t sVar11;
  Vector *result_1;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar4 = 8;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      input.micros = *(int64_t *)((long)&ldata->months + lVar4);
      input._0_8_ = *(undefined8 *)((long)ldata + lVar4 + -8);
      sVar11 = StringCast::Operation<duckdb::interval_t>(input,(Vector *)dataptr);
      *(long *)((long)result_data + lVar4 + -8) = sVar11.value._0_8_;
      *(long *)((long)&result_data->value + lVar4) = sVar11.value._8_8_;
      lVar4 = lVar4 + 0x10;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    uVar7 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
LAB_017851f6:
        uVar5 = uVar7 << 4 | 8;
        for (; uVar2 = uVar7, uVar7 < uVar8; uVar7 = uVar7 + 1) {
          input_00.micros = *(int64_t *)((long)&ldata->months + uVar5);
          input_00._0_8_ = *(undefined8 *)((long)ldata + (uVar5 - 8));
          sVar11 = StringCast::Operation<duckdb::interval_t>(input_00,(Vector *)dataptr);
          *(long *)((long)result_data + (uVar5 - 8)) = sVar11.value._0_8_;
          *(long *)((long)&result_data->value + uVar5) = sVar11.value._8_8_;
          uVar5 = uVar5 + 0x10;
        }
      }
      else {
        uVar5 = puVar1[uVar3];
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_017851f6;
        uVar2 = uVar8;
        if (uVar5 != 0) {
          uVar9 = uVar7 << 4 | 8;
          for (uVar6 = 0; uVar2 = uVar6 + uVar7, uVar6 + uVar7 < uVar8; uVar6 = uVar6 + 1) {
            if ((uVar5 >> (uVar6 & 0x3f) & 1) != 0) {
              input_01.micros = *(int64_t *)((long)&ldata->months + uVar9);
              input_01._0_8_ = *(undefined8 *)((long)ldata + (uVar9 - 8));
              sVar11 = StringCast::Operation<duckdb::interval_t>(input_01,(Vector *)dataptr);
              *(long *)((long)result_data + (uVar9 - 8)) = sVar11.value._0_8_;
              *(long *)((long)&result_data->value + uVar9) = sVar11.value._8_8_;
            }
            uVar9 = uVar9 + 0x10;
          }
        }
      }
      uVar7 = uVar2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}